

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall TRM::Model::Model(Model *this,char *filename)

{
  int iVar1;
  istream *piVar2;
  long *plVar3;
  int *piVar4;
  ostream *poVar5;
  int i;
  length_type lVar6;
  char trash;
  Model *local_440;
  vector<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  *local_438;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *local_430;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_428;
  TGAImage *local_420;
  TGAImage *local_418;
  TGAImage *local_410;
  Vec3i tmp;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  f;
  string line;
  ifstream in;
  byte abStack_398 [488];
  istringstream iss;
  
  local_438 = &this->faces_;
  local_428 = &this->norms_;
  local_430 = &this->uv_;
  local_410 = &this->diffusemap_;
  (this->uv_).
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uv_).
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->norms_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->uv_).
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->norms_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->norms_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces_).
  super__Vector_base<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces_).
  super__Vector_base<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->verts_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->faces_).
  super__Vector_base<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verts_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verts_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_440 = this;
  TGAImage::TGAImage(local_410);
  local_418 = &this->normalmap_;
  TGAImage::TGAImage(local_418);
  local_420 = &this->specularmap_;
  TGAImage::TGAImage(local_420);
  std::ifstream::ifstream(&in);
  std::ifstream::open((char *)&in,(_Ios_Openmode)filename);
  if ((abStack_398[*(long *)(_in + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while ((abStack_398[*(long *)(_in + -0x18)] & 2) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&line)
      ;
      std::__cxx11::string::string((string *)&f,line._M_dataplus._M_p,(allocator *)&tmp);
      std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&f,_S_in);
      std::__cxx11::string::~string((string *)&f);
      iVar1 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x2);
      if (iVar1 == 0) {
        std::operator>>((istream *)&iss,&trash);
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                    ((vec<3,_float,_(glm::qualifier)0> *)&f,lVar6);
          std::istream::_M_extract<float>((float *)&iss);
        }
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&local_440->verts_,(vec<3,_float,_(glm::qualifier)0> *)&f);
      }
      else {
        iVar1 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x3);
        if (iVar1 == 0) {
          piVar2 = std::operator>>((istream *)&iss,&trash);
          std::operator>>(piVar2,&trash);
          for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
            glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                      ((vec<3,_float,_(glm::qualifier)0> *)&f,lVar6);
            std::istream::_M_extract<float>((float *)&iss);
          }
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::push_back(local_428,(vec<3,_float,_(glm::qualifier)0> *)&f);
        }
        else {
          iVar1 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x3);
          if (iVar1 == 0) {
            piVar2 = std::operator>>((istream *)&iss,&trash);
            std::operator>>(piVar2,&trash);
            for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
              glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                        ((vec<2,_float,_(glm::qualifier)0> *)&f,lVar6);
              std::istream::_M_extract<float>((float *)&iss);
            }
            std::
            vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            ::push_back(local_430,(value_type *)&f);
          }
          else {
            iVar1 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x2);
            if (iVar1 == 0) {
              f.
              super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              f.
              super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              f.
              super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::operator>>((istream *)&iss,&trash);
              while( true ) {
                piVar2 = (istream *)std::istream::operator>>((istream *)&iss,(int *)&tmp);
                piVar2 = std::operator>>(piVar2,&trash);
                piVar2 = (istream *)std::istream::operator>>(piVar2,&tmp.field_1.y);
                piVar2 = std::operator>>(piVar2,&trash);
                plVar3 = (long *)std::istream::operator>>(piVar2,&tmp.field_2.z);
                if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
                for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                  piVar4 = glm::vec<3,_int,_(glm::qualifier)0>::operator[](&tmp,lVar6);
                  *piVar4 = *piVar4 + -1;
                }
                std::
                vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                ::push_back(&f,&tmp);
              }
              std::
              vector<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
              ::push_back(local_438,(value_type *)&f);
              std::
              _Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
              ::~_Vector_base((_Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                               *)&f);
            }
          }
        }
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"# v# ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," f# ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," vt# ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," vn# ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&in);
  return;
}

Assistant:

Model::Model(const char *filename)
    : verts_(),
      faces_(),
      norms_(),
      uv_(),
      diffusemap_(),
      normalmap_(),
      specularmap_() {
  std::ifstream in;
  in.open(filename, std::ifstream::in);
  if (in.fail()) return;
  std::string line;
  while (!in.eof()) {
    std::getline(in, line);
    std::istringstream iss(line.c_str());
    char trash;
    if (!line.compare(0, 2, "v ")) {
      iss >> trash;
      Vec3f v;
      for (int i = 0; i < 3; i++) iss >> v[i];
      verts_.push_back(v);
    } else if (!line.compare(0, 3, "vn ")) {
      iss >> trash >> trash;
      Vec3f n;
      for (int i = 0; i < 3; i++) iss >> n[i];
      norms_.push_back(n);
    } else if (!line.compare(0, 3, "vt ")) {
      iss >> trash >> trash;
      Vec2f uv;
      for (int i = 0; i < 2; i++) iss >> uv[i];
      uv_.push_back(uv);
    } else if (!line.compare(0, 2, "f ")) {
      std::vector<Vec3i> f;
      Vec3i tmp;
      iss >> trash;
      while (iss >> tmp[0] >> trash >> tmp[1] >> trash >> tmp[2]) {
        for (int i = 0; i < 3; i++)
          tmp[i]--;  // in wavefront obj all indices start at 1, not zero
        f.push_back(tmp);
      }
      faces_.push_back(f);
    }
  }
  std::cerr << "# v# " << verts_.size() << " f# " << faces_.size() << " vt# "
            << uv_.size() << " vn# " << norms_.size() << std::endl;
  //    load_texture(filename, "_diffuse.tga", diffusemap_);
  //    load_texture(filename, "_nm_tangent.tga",      normalmap_);
  //    load_texture(filename, "_spec.tga",    specularmap_);
}